

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O0

void add_radial_scalar(FmsDataCollection dc,FmsComponent volume,char *name,int order,int *dims,
                      double *verts,int nverts,int *edges,int nedges,int *faces,int nfaces,
                      int ncells)

{
  int iVar1;
  double *dest;
  double *pdVar2;
  double *pdVar3;
  void *__ptr;
  int in_ECX;
  FmsInt in_RDX;
  FmsComponent in_RSI;
  FmsFieldDescriptor in_RDI;
  double *in_R9;
  double dVar4;
  FmsMetaData mdata;
  FmsField f;
  FmsFieldDescriptor fd;
  char fdname [100];
  double *z;
  double *y;
  double *x;
  double *coords;
  double *data;
  int ndofs;
  int i;
  FmsMetaData *in_stack_ffffffffffffff20;
  FmsField in_stack_ffffffffffffff28;
  FmsScalarType in_stack_ffffffffffffff30;
  FmsLayoutType in_stack_ffffffffffffff34;
  FmsMetaData in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  FmsDataCollection in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  int *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  double *pdVar5;
  int *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar6;
  int order_00;
  
  sprintf(&stack0xffffffffffffff38,"%s descriptor",in_RDX);
  FmsDataCollectionAddFieldDescriptor
            (in_stack_ffffffffffffff48,
             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (FmsFieldDescriptor *)in_stack_ffffffffffffff38);
  FmsFieldDescriptorSetComponent
            ((FmsFieldDescriptor)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_RSI);
  FmsFieldDescriptorSetFixedOrder
            (in_RDI,(FmsFieldType)((ulong)in_RSI >> 0x20),(FmsBasisType)in_RSI,in_RDX);
  iVar1 = dofs_for_order(in_ECX,(int)mdata,(int)fd,fdname._8_4_,fdname._16_4_);
  dest = (double *)malloc((long)iVar1 * 0x18);
  pdVar3 = dest + iVar1;
  pdVar5 = dest + (iVar1 << 1);
  append_coord_dofs_verts(dest,in_R9,(int)mdata,0);
  append_coord_dofs_edge
            (in_stack_ffffffffffffff74,
             (double *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
             (double)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  pdVar2 = append_coord_dofs_face
                     (in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                      in_stack_ffffffffffffff78,
                      (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c,(double)in_stack_ffffffffffffff60,(int)pdVar5);
  pdVar2 = append_coord_dofs_cell
                     ((int)((ulong)in_R9 >> 0x20),
                      (double *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),in_stack_ffffffffffffffc0,
                      dest,(double)pdVar2,(int)((ulong)pdVar3 >> 0x20));
  append_coord_dofs_verts(pdVar3,in_R9,(int)mdata,1);
  append_coord_dofs_edge
            (in_stack_ffffffffffffff74,
             (double *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
             (double)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  pdVar3 = append_coord_dofs_face
                     (in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                      in_stack_ffffffffffffff78,
                      (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c,(double)in_stack_ffffffffffffff60,(int)pdVar5);
  pdVar3 = append_coord_dofs_cell
                     ((int)((ulong)in_R9 >> 0x20),
                      (double *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),in_stack_ffffffffffffffc0,
                      dest,(double)pdVar2,(int)((ulong)pdVar3 >> 0x20));
  iVar6 = (int)((ulong)pdVar3 >> 0x20);
  append_coord_dofs_verts(pdVar5,in_R9,(int)mdata,2);
  order_00 = (int)((ulong)in_R9 >> 0x20);
  pdVar3 = append_coord_dofs_edge
                     (in_stack_ffffffffffffff74,
                      (double *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                      (double)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  append_coord_dofs_face
            (in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,
             (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c,(double)in_stack_ffffffffffffff60,(int)pdVar3);
  append_coord_dofs_cell
            (order_00,(double *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),in_stack_ffffffffffffffc0,
             dest,(double)pdVar2,iVar6);
  pdVar5 = dest + iVar1;
  pdVar2 = dest + (iVar1 << 1);
  pdVar3 = dest;
  __ptr = malloc((long)iVar1 << 3);
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    dVar4 = sqrt(pdVar2[iVar6] * pdVar2[iVar6] +
                 dest[iVar6] * dest[iVar6] + pdVar5[iVar6] * pdVar5[iVar6]);
    *(double *)((long)__ptr + (long)iVar6 * 8) = dVar4;
  }
  FmsDataCollectionAddField
            (in_stack_ffffffffffffff48,
             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (FmsField *)in_stack_ffffffffffffff38);
  FmsFieldSet((FmsField)in_stack_ffffffffffffff48,
              (FmsFieldDescriptor)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              (FmsInt)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
              in_stack_ffffffffffffff28);
  FmsFieldAttachMetaData(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  FmsMetaDataSetString
            (in_stack_ffffffffffffff38,
             (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (char *)in_stack_ffffffffffffff28);
  free(__ptr);
  free(pdVar3);
  return;
}

Assistant:

void
add_radial_scalar(FmsDataCollection dc, FmsComponent volume,
                  const char *name, int order, const int *dims,
                  const double *verts, int nverts,
                  const int *edges, int nedges,
                  const int *faces, int nfaces,
                  int ncells) {
  int i, ndofs;
  double *data, *coords, *x, *y, *z;
  char fdname[100];

  /* Create a field descriptor for the coordinates that live on "surface". */
  sprintf(fdname, "%s descriptor", name);
  FmsFieldDescriptor fd;
  FmsDataCollectionAddFieldDescriptor(dc, fdname, &fd);
  FmsFieldDescriptorSetComponent(fd, volume);
  FmsFieldDescriptorSetFixedOrder(fd, FMS_CONTINUOUS,
                                  FMS_NODAL_GAUSS_CLOSED, order);

  /* First, make coordinates of the target order. */
  ndofs = dofs_for_order(order, nverts, nedges, nfaces, ncells);

  /* Make the coordinate data. Make it BYNODE xxxx...yyyy...zzzz... */
  coords = (double *)malloc(ndofs * sizeof(double)*3);
  x = coords;
  y = coords + ndofs;
  z = coords + 2*ndofs;

  /* Store coordinate dofs by node. */
  x = append_coord_dofs_verts(x, verts, nverts, 0);
  x = append_coord_dofs_edge(order, x, verts, edges, nedges, 0., 0);
  x = append_coord_dofs_face(order, x, verts, edges, faces, nfaces, 0., 0);
  x = append_coord_dofs_cell(order, x, dims, verts, 0., 0);

  y = append_coord_dofs_verts(y, verts, nverts, 1);
  y = append_coord_dofs_edge(order, y, verts, edges, nedges, 0., 1);
  y = append_coord_dofs_face(order, y, verts, edges, faces, nfaces, 0., 1);
  y = append_coord_dofs_cell(order, y, dims, verts, 0., 1);

  z = append_coord_dofs_verts(z, verts, nverts, 2);
  z = append_coord_dofs_edge(order, z, verts, edges, nedges, 0., 2);
  z = append_coord_dofs_face(order, z, verts, edges, faces, nfaces, 0., 2);
  z = append_coord_dofs_cell(order, z, dims, verts, 0., 2);

  /* Make the radial data. */
  x = coords;
  y = coords + ndofs;
  z = coords + 2*ndofs;
  data = (double *)malloc(ndofs * sizeof(double));
  for(i = 0; i < ndofs; ++i) {
    data[i] = sqrt(x[i]*x[i] + y[i]*y[i] + z[i]*z[i]);
  }

#if 0
  /* Write coordinate dofs as Point3D so we can plot them. */
  char tmp[100];
  sprintf(tmp, "%s.3D", name);
  FILE *fp = fopen(tmp, "wt");
  fprintf(fp, "X Y Z dof\n");
  for(i = 0; i < ndofs; ++i)
    fprintf(fp, "%lg %lg 0. %f\n", coords[i*2],coords[i*2+1], data[i]);
  fclose(fp);
#endif

  /* Add the coordinates to the data collection. */
  FmsField f;
  FmsDataCollectionAddField(dc, name, &f);
  FmsFieldSet(f, fd, 1, FMS_BY_VDIM, FMS_DOUBLE, data);

  /* Add some field metadata. (optional) */
  FmsMetaData mdata;
  FmsFieldAttachMetaData(f, &mdata);
  FmsMetaDataSetString(mdata, "units", "cm");

  free(data);
  free(coords);
}